

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffreopen(fitsfile *openfptr,fitsfile **newfptr,int *status)

{
  int *piVar1;
  FITSfile *pFVar2;
  int iVar3;
  fitsfile *pfVar4;
  
  if (0 < *status) {
    return *status;
  }
  if (openfptr == (fitsfile *)0x0) {
    *status = 0x73;
    iVar3 = 0x73;
  }
  else if (openfptr->Fptr->validcode == 0x22b) {
    pfVar4 = (fitsfile *)calloc(1,0x10);
    *newfptr = pfVar4;
    pFVar2 = openfptr->Fptr;
    pfVar4->Fptr = pFVar2;
    piVar1 = &pFVar2->open_count;
    *piVar1 = *piVar1 + 1;
    iVar3 = *status;
  }
  else {
    *status = 0x72;
    iVar3 = 0x72;
  }
  return iVar3;
}

Assistant:

int ffreopen(fitsfile *openfptr, /* I - FITS file pointer to open file  */ 
             fitsfile **newfptr,  /* O - pointer to new re opened file   */
             int *status)        /* IO - error status                   */
/*
  Reopen an existing FITS file with either readonly or read/write access.
  The reopened file shares the same FITSfile structure but may point to a
  different HDU within the file.
*/
{
    if (*status > 0)
        return(*status);

    /* check that the open file pointer is valid */
    if (!openfptr)
        return(*status = NULL_INPUT_PTR);
    else if ((openfptr->Fptr)->validcode != VALIDSTRUC) /* check magic value */
        return(*status = BAD_FILEPTR); 

        /* allocate fitsfile structure and initialize = 0 */
    *newfptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    (*newfptr)->Fptr = openfptr->Fptr; /* both point to the same structure */
    (*newfptr)->HDUposition = 0;  /* set initial position to primary array */
    (((*newfptr)->Fptr)->open_count)++;   /* increment the file usage counter */

    return(*status);
}